

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

Var Js::JavascriptArray::EveryHelper<unsigned_long>
              (JavascriptArray *pArr,TypedArrayBase *typedArrayBase,RecyclableObject *obj,
              unsigned_long length,Arguments *args,ScriptContext *scriptContext)

{
  code *pcVar1;
  Var pvVar2;
  Var pvVar3;
  Var pvVar4;
  bool bVar5;
  uint32 uVar6;
  int iVar7;
  BOOL BVar8;
  ThreadContext *pTVar9;
  Var pvVar10;
  undefined4 *puVar11;
  unsigned_long *puVar12;
  undefined4 extraout_var;
  JavascriptMethod p_Var13;
  Var pvVar14;
  JavascriptLibrary *pJVar15;
  CallInfo local_d0;
  CallInfo local_c8;
  undefined1 local_c0 [8];
  AutoReentrancyHandler autoReentrancyHandler;
  ulong uStack_a8;
  uint32 k;
  uint local_9c;
  Var pvStack_98;
  uint32 end;
  Var testResult;
  Var element;
  Var thisArg;
  RecyclableObject *callBackFn;
  undefined1 local_68 [8];
  JsReentLock jsReentLock;
  ScriptContext *scriptContext_local;
  Arguments *args_local;
  unsigned_long length_local;
  RecyclableObject *obj_local;
  TypedArrayBase *typedArrayBase_local;
  JavascriptArray *pArr_local;
  
  jsReentLock._24_8_ = scriptContext;
  args_local = (Arguments *)length;
  length_local = (unsigned_long)obj;
  obj_local = (RecyclableObject *)typedArrayBase;
  typedArrayBase_local = (TypedArrayBase *)pArr;
  pTVar9 = ScriptContext::GetThreadContext(scriptContext);
  JsReentLock::JsReentLock((JsReentLock *)local_68,pTVar9);
  JsReentLock::setObjectForMutation((JsReentLock *)local_68,typedArrayBase_local);
  if (1 < (SUB84(args->Info,0) & 0xffffff)) {
    pvVar10 = Arguments::operator[](args,1);
    bVar5 = JavascriptConversion::IsCallable(pvVar10);
    if (bVar5) {
      pvVar10 = Arguments::operator[](args,1);
      thisArg = VarTo<Js::RecyclableObject>(pvVar10);
      element = (Var)0x0;
      if ((SUB84(args->Info,0) & 0xffffff) < 3) {
        pJVar15 = ScriptContext::GetLibrary((ScriptContext *)jsReentLock._24_8_);
        element = JavascriptLibraryBase::GetUndefined(&pJVar15->super_JavascriptLibraryBase);
      }
      else {
        element = Arguments::operator[](args,2);
      }
      if (((obj_local == (RecyclableObject *)0x0) && (typedArrayBase_local == (TypedArrayBase *)0x0)
          ) && (bVar5 = VarIs<Js::TypedArrayBase,Js::RecyclableObject>
                                  ((RecyclableObject *)length_local), bVar5)) {
        obj_local = (RecyclableObject *)
                    UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>
                              ((RecyclableObject *)length_local);
      }
      testResult = (Var)0x0;
      pvStack_98 = (Var)0x0;
      if (obj_local == (RecyclableObject *)0x0) {
        JsReentLock::unlock((JsReentLock *)local_68);
        pArr_local = (JavascriptArray *)
                     EveryObjectHelper<unsigned_long>
                               ((RecyclableObject *)length_local,(unsigned_long)args_local,0,
                                (RecyclableObject *)thisArg,element,
                                (ScriptContext *)jsReentLock._24_8_);
      }
      else {
        bVar5 = VarIsCorrectType<Js::TypedArrayBase>((TypedArrayBase *)obj_local);
        if (!bVar5) {
          bVar5 = VarIsCorrectType<Js::TypedArrayBase>((TypedArrayBase *)obj_local);
          if (!bVar5) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar11 = 1;
            bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                        ,0x22f7,"(VarIsCorrectType(typedArrayBase))",
                                        "VarIsCorrectType(typedArrayBase)");
            if (!bVar5) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar11 = 0;
          }
          Throw::FatalInternalError(-0x7fffbffb);
        }
        uVar6 = ArrayObject::GetLength((ArrayObject *)obj_local);
        uStack_a8 = (ulong)uVar6;
        puVar12 = min<unsigned_long>((unsigned_long *)&args_local,&stack0xffffffffffffff58);
        local_9c = (uint)*puVar12;
        for (autoReentrancyHandler._12_4_ = 0; (uint)autoReentrancyHandler._12_4_ < local_9c;
            autoReentrancyHandler._12_4_ = autoReentrancyHandler._12_4_ + 1) {
          iVar7 = (*(obj_local->super_FinalizableObject).super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x72])
                            (obj_local,(ulong)(uint)autoReentrancyHandler._12_4_);
          testResult = (Var)CONCAT44(extraout_var,iVar7);
          JsReentLock::unlock((JsReentLock *)local_68);
          pTVar9 = ScriptContext::GetThreadContext((ScriptContext *)jsReentLock._24_8_);
          AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_c0,pTVar9);
          pTVar9 = ScriptContext::GetThreadContext((ScriptContext *)jsReentLock._24_8_);
          ThreadContext::CheckAndResetReentrancySafeOrHandled(pTVar9);
          pTVar9 = ScriptContext::GetThreadContext((ScriptContext *)jsReentLock._24_8_);
          ThreadContext::AssertJsReentrancy(pTVar9);
          pvVar10 = thisArg;
          p_Var13 = RecyclableObject::GetEntryPoint((RecyclableObject *)thisArg);
          CheckIsExecutable((RecyclableObject *)pvVar10,p_Var13);
          p_Var13 = RecyclableObject::GetEntryPoint((RecyclableObject *)thisArg);
          pvVar3 = thisArg;
          CallInfo::CallInfo(&local_c8,CallFlags_Value,4);
          pvVar4 = thisArg;
          CallInfo::CallInfo(&local_d0,CallFlags_Value,4);
          pvVar2 = element;
          pvVar10 = testResult;
          pvVar14 = JavascriptNumber::ToVar
                              (autoReentrancyHandler._12_4_,(ScriptContext *)jsReentLock._24_8_);
          pvStack_98 = (*p_Var13)((RecyclableObject *)pvVar3,(CallInfo)pvVar4,local_c8,0,0,0,0,
                                  local_d0,pvVar2,pvVar10,pvVar14,obj_local);
          AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_c0);
          JsReentLock::MutateArrayObject((JsReentLock *)local_68);
          JsReentLock::relock((JsReentLock *)local_68);
          BVar8 = JavascriptConversion::ToBoolean(pvStack_98,(ScriptContext *)jsReentLock._24_8_);
          if (BVar8 == 0) {
            pJVar15 = ScriptContext::GetLibrary((ScriptContext *)jsReentLock._24_8_);
            pArr_local = (JavascriptArray *)
                         JavascriptLibraryBase::GetFalse(&pJVar15->super_JavascriptLibraryBase);
            goto LAB_01100efc;
          }
        }
        pJVar15 = ScriptContext::GetLibrary((ScriptContext *)jsReentLock._24_8_);
        pArr_local = (JavascriptArray *)
                     JavascriptLibraryBase::GetTrue(&pJVar15->super_JavascriptLibraryBase);
      }
LAB_01100efc:
      JsReentLock::~JsReentLock((JsReentLock *)local_68);
      return pArr_local;
    }
  }
  if (obj_local == (RecyclableObject *)0x0) {
    JavascriptError::ThrowTypeError
              ((ScriptContext *)jsReentLock._24_8_,-0x7ff5ec34,L"Array.prototype.every");
  }
  JavascriptError::ThrowTypeError
            ((ScriptContext *)jsReentLock._24_8_,-0x7ff5ec34,L"[TypedArray].prototype.every");
}

Assistant:

Var JavascriptArray::EveryHelper(JavascriptArray* pArr, Js::TypedArrayBase* typedArrayBase, RecyclableObject* obj, T length, Arguments& args, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, pArr);

        if (args.Info.Count < 2 || !JavascriptConversion::IsCallable(args[1]))
        {
            // typedArrayBase is only non-null if and only if we came here via the TypedArray entrypoint
            if (typedArrayBase != nullptr)
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("[TypedArray].prototype.every"));
            }
            else
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("Array.prototype.every"));
            }
        }

        RecyclableObject* callBackFn = VarTo<RecyclableObject>(args[1]);
        Var thisArg = nullptr;


        if (args.Info.Count > 2)
        {
            thisArg = args[2];
        }
        else
        {
            thisArg = scriptContext->GetLibrary()->GetUndefined();
        }

        // If we came from Array.prototype.map and source object is not a JavascriptArray, source could be a TypedArray
        if (typedArrayBase == nullptr && pArr == nullptr && VarIs<TypedArrayBase>(obj))
        {
            typedArrayBase = UnsafeVarTo<TypedArrayBase>(obj);
        }

        Var element = nullptr;
        Var testResult = nullptr;
        if (typedArrayBase)
        {
            AssertAndFailFast(VarIsCorrectType(typedArrayBase));
            uint32 end = (uint32)min(length, (T)typedArrayBase->GetLength());

            for (uint32 k = 0; k < end; k++)
            {
                // No need to do HasItem, as it cannot be observable unless 'typedArrayBase' is proxy. And we have established that it is indeed typedarray.

                element = typedArrayBase->DirectGetItem(k);

                JS_REENTRANT(jsReentLock,
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        testResult = CALL_FUNCTION(scriptContext->GetThreadContext(), callBackFn, CallInfo(CallFlags_Value, 4), thisArg,
                                element,
                                JavascriptNumber::ToVar(k, scriptContext),
                                typedArrayBase);
                    }
                    END_SAFE_REENTRANT_CALL
                );

                if (!JavascriptConversion::ToBoolean(testResult, scriptContext))
                {
                    return scriptContext->GetLibrary()->GetFalse();
                }
            }
        }
        else
        {
            JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::EveryObjectHelper<T>(obj, length, 0u, callBackFn, thisArg, scriptContext));
        }

        return scriptContext->GetLibrary()->GetTrue();
    }